

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

void jsoncons::jsonpointer::
     add<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *value,
               bool create_if_missing,error_code *ec)

{
  const_array_iterator pos;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  reference pbVar3;
  long lVar4;
  char *pcVar5;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *args;
  pointer this_01;
  byte in_CL;
  to_integer_errc tVar7;
  string_view_type *in_RDI;
  error_code *in_R8;
  undefined1 auVar8 [16];
  type tVar9;
  pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
  r;
  array_iterator it2;
  type result;
  size_t index;
  iterator end;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *current;
  basic_json_pointer<char> *in_stack_fffffffffffffe48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe50;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  string_view_type *psVar10;
  error_code *in_stack_fffffffffffffe60;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_02;
  undefined7 in_stack_fffffffffffffeb8;
  error_code *in_stack_fffffffffffffed0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string_view_type *in_stack_fffffffffffffee0;
  string_view_type *in_stack_fffffffffffffee8;
  string_view_type *in_stack_fffffffffffffef0;
  array_range_type local_e0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_d0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_c8;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_b8;
  char *local_b0;
  to_integer_errc local_a8;
  char *local_a0;
  to_integer_errc local_98;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_90;
  undefined4 local_84;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_50 [2];
  string_view_type *local_30;
  error_code *local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_30 = in_RDI;
  local_28 = in_R8;
  std::__cxx11::string::string((string *)local_50);
  local_58._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       basic_json_pointer<char>::begin_abi_cxx11_(in_stack_fffffffffffffe48);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             basic_json_pointer<char>::end_abi_cxx11_(in_stack_fffffffffffffe48);
  do {
    do {
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe50,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe48);
      if (!bVar2) {
        bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                          (in_stack_fffffffffffffe68);
        if (bVar2) {
          lVar4 = std::__cxx11::string::size();
          if (lVar4 == 1) {
            pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
            if (*pcVar5 == '-') {
              basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
              emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                        (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
              psVar10 = local_30;
              pbVar6 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                 (in_stack_fffffffffffffe58);
              local_30 = (string_view_type *)
                         basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                   (pbVar6,(size_t)psVar10);
              goto LAB_00546b84;
            }
          }
          local_90 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0;
          pbVar6 = local_50;
          this = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 std::__cxx11::string::data();
          std::__cxx11::string::length();
          tVar9 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                            (in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68,
                             (unsigned_long *)in_stack_fffffffffffffe60);
          local_b0 = tVar9.ptr;
          tVar7 = tVar9.ec;
          local_a8 = tVar7;
          local_a0 = local_b0;
          local_98 = tVar7;
          bVar2 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                            ((to_integer_result *)&local_a0);
          if (!bVar2) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe60,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
            local_84 = 1;
            goto LAB_00546b8f;
          }
          this_02 = local_90;
          this_00 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                              (in_stack_fffffffffffffe58);
          pbVar1 = local_90;
          if (this_00 < this_02) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe60,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
            local_84 = 1;
            goto LAB_00546b8f;
          }
          args = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                           (in_stack_fffffffffffffe58);
          if (pbVar1 == args) {
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                      (this_02,args);
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                      (in_stack_fffffffffffffe58);
            local_30 = (string_view_type *)
                       basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                 (in_stack_fffffffffffffed8,(size_t)in_stack_fffffffffffffed0);
          }
          else {
            psVar10 = local_30;
            local_e0 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                                 (this_00);
            local_d0 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                       ::begin(&local_e0);
            local_c8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __gnu_cxx::
                       __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::operator+((__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                    *)psVar10,(difference_type)in_stack_fffffffffffffe50);
            __gnu_cxx::
            __normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
            ::
            __normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*>
                      ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe50,
                       (__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffe48);
            pos._M_current._7_1_ = tVar7;
            pos._M_current._0_7_ = in_stack_fffffffffffffeb8;
            local_b8._M_current =
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
                 insert<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                           (this,pos,pbVar6);
            local_30 = (string_view_type *)
                       __gnu_cxx::
                       __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_b8);
          }
        }
        else {
          bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                            (in_stack_fffffffffffffe68);
          if (!bVar2) {
            std::error_code::operator=
                      (in_stack_fffffffffffffe60,
                       (jsonpointer_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
            local_84 = 1;
            goto LAB_00546b8f;
          }
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
          basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
          insert_or_assign<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>&>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                     (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffee0);
          this_01 = jsoncons::detail::
                    random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                    ::operator->((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                                  *)0x546b51);
          local_30 = (string_view_type *)
                     key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                     ::value(this_01);
        }
LAB_00546b84:
        local_84 = 0;
        goto LAB_00546b8f;
      }
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_58);
      std::__cxx11::string::operator=((string *)local_50,(string *)pbVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_58);
      bVar2 = __gnu_cxx::operator!=
                        (in_stack_fffffffffffffe50,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe48);
    } while (!bVar2);
    in_stack_fffffffffffffee8 = local_30;
    auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    local_80 = auVar8;
    in_stack_fffffffffffffef0 =
         (string_view_type *)
         detail::resolve<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                   ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                    in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                    SUB81((ulong)in_stack_fffffffffffffed8 >> 0x38,0),in_stack_fffffffffffffed0);
    local_30 = in_stack_fffffffffffffef0;
    bVar2 = std::error_code::operator_cast_to_bool(local_28);
  } while (!bVar2);
  local_84 = 1;
LAB_00546b8f:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void add(Json& root, 
             const basic_json_pointer<typename Json::char_type>& location, 
             T&& value, 
             bool create_if_missing,
             std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, create_if_missing, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                current->emplace_back(std::forward<T>(value));
                current = std::addressof(current->at(current->size()-1));
            }
            else
            {
                std::size_t index{0};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index > current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                if (index == current->size())
                {
                    current->emplace_back(std::forward<T>(value));
                    current = std::addressof(current->at(current->size()-1));
                }
                else
                {
                    auto it2 = current->insert(current->array_range().begin()+index,std::forward<T>(value));
                    current = std::addressof(*it2);
                }
            }
        }
        else if (current->is_object())
        {
            auto r = current->insert_or_assign(buffer,std::forward<T>(value));
            current = std::addressof(r.first->value());
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }